

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_error_code_e ktxTexture2_constructCommon(ktxTexture2 *This,ktx_uint32_t numLevels)

{
  size_t __size;
  ktxTexture_protected *pkVar1;
  PFNCALCFACELODSIZE p_Var2;
  ktxTexture2_private *__s;
  ktx_error_code_e kVar3;
  
  if (This != (ktxTexture2 *)0x0) {
    This->classId = ktxTexture2_c;
    This->vtbl = &ktxTexture2_vtbl;
    p_Var2 = ktxTexture2_vtblInt.calcFaceLodSize;
    pkVar1 = This->_protected;
    (pkVar1->_vtbl).calcDataSizeLevels = ktxTexture2_vtblInt.calcDataSizeLevels;
    (pkVar1->_vtbl).calcFaceLodSize = p_Var2;
    (pkVar1->_vtbl).calcLevelOffset = ktxTexture2_vtblInt.calcLevelOffset;
    __size = (ulong)(numLevels - 1) * 0x18 + 0x38;
    __s = (ktxTexture2_private *)malloc(__size);
    This->_private = __s;
    if (__s == (ktxTexture2_private *)0x0) {
      kVar3 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar3 = KTX_SUCCESS;
      memset(__s,0,__size);
    }
    return kVar3;
  }
  __assert_fail("This != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                ,0x17b,"ktx_error_code_e ktxTexture2_constructCommon(ktxTexture2 *, ktx_uint32_t)");
}

Assistant:

static KTX_error_code
ktxTexture2_constructCommon(ktxTexture2* This, ktx_uint32_t numLevels)
{
    assert(This != NULL);
    ktx_size_t privateSize;

    This->classId = ktxTexture2_c;
    This->vtbl = &ktxTexture2_vtbl;
    This->_protected->_vtbl = ktxTexture2_vtblInt;
    privateSize = sizeof(ktxTexture2_private)
                + sizeof(ktxLevelIndexEntry) * (numLevels - 1);
    This->_private = (ktxTexture2_private*)malloc(privateSize);
    if (This->_private == NULL) {
        return KTX_OUT_OF_MEMORY;
    }
    memset(This->_private, 0, privateSize);
    return KTX_SUCCESS;
}